

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger default_delegate_tofloat(HSQUIRRELVM v)

{
  SQObjectType SVar1;
  bool bVar2;
  SQObjectPtr *pSVar3;
  SQRESULT SVar4;
  SQObjectPtr res;
  SQObjectPtr local_30;
  SQObjectPtr local_20;
  
  pSVar3 = SQVM::GetAt(v,v->_stackbase);
  SVar1 = (pSVar3->super_SQObject)._type;
  if ((int)SVar1 < 0x5000004) {
    if (SVar1 == OT_BOOL) {
      if ((pSVar3->super_SQObject)._unVal.pTable == (SQTable *)0x0) {
        local_30.super_SQObject._unVal.fFloat = (SQFloat)0;
      }
      else {
        local_30.super_SQObject._unVal.fFloat = (SQFloat)0x3f800000;
      }
      local_30.super_SQObject._type = OT_FLOAT;
      local_30.super_SQObject._unVal.nInteger._4_4_ = 0;
      SQVM::Push(v,&local_30);
      goto LAB_001292de;
    }
    if (SVar1 != OT_INTEGER) goto LAB_00129278;
  }
  else if (SVar1 != OT_FLOAT) {
    if (SVar1 == OT_STRING) {
      local_30.super_SQObject._unVal.pTable = (SQTable *)0x0;
      local_30.super_SQObject._type = OT_NULL;
      bVar2 = str2num(((pSVar3->super_SQObject)._unVal.pString)->_val,&local_30,10);
      if (bVar2) {
        if (local_30.super_SQObject._type == OT_INTEGER) {
          local_20.super_SQObject._unVal.fFloat = (SQFloat)local_30.super_SQObject._unVal.nInteger;
        }
        else {
          local_20.super_SQObject._unVal.fFloat = local_30.super_SQObject._unVal.fFloat;
        }
        local_20.super_SQObject._type = OT_FLOAT;
        local_20.super_SQObject._unVal.nInteger._4_4_ = 0;
        SQVM::Push(v,&local_20);
        SQObjectPtr::~SQObjectPtr(&local_20);
        SQObjectPtr::~SQObjectPtr(&local_30);
        if (bVar2) {
          return 1;
        }
      }
      else {
        SQObjectPtr::~SQObjectPtr(&local_30);
      }
      SVar4 = sq_throwerror(v,"cannot convert the string");
      return SVar4;
    }
LAB_00129278:
    SQVM::PushNull(v);
    return 1;
  }
  if ((pSVar3->super_SQObject)._type == OT_INTEGER) {
    local_30.super_SQObject._unVal.fFloat = (SQFloat)(pSVar3->super_SQObject)._unVal.nInteger;
  }
  else {
    local_30.super_SQObject._unVal.fFloat = (pSVar3->super_SQObject)._unVal.fFloat;
  }
  local_30.super_SQObject._type = OT_FLOAT;
  local_30.super_SQObject._unVal.nInteger._4_4_ = 0;
  SQVM::Push(v,&local_30);
LAB_001292de:
  SQObjectPtr::~SQObjectPtr(&local_30);
  return 1;
}

Assistant:

static SQInteger default_delegate_tofloat(HSQUIRRELVM v)
{
    SQObjectPtr &o=stack_get(v,1);
    switch(sq_type(o)){
    case OT_STRING:{
        SQObjectPtr res;
        if(str2num(_stringval(o),res,10)){
            v->Push(SQObjectPtr(tofloat(res)));
            break;
        }}
        return sq_throwerror(v, _SC("cannot convert the string"));
        break;
    case OT_INTEGER:case OT_FLOAT:
        v->Push(SQObjectPtr(tofloat(o)));
        break;
    case OT_BOOL:
        v->Push(SQObjectPtr((SQFloat)(_integer(o)?1:0)));
        break;
    default:
        v->PushNull();
        break;
    }
    return 1;
}